

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

bool highsPause(bool pause_condition,string *message)

{
  undefined8 uVar1;
  char *pcVar2;
  byte in_DIL;
  char str [100];
  char local_78 [118];
  byte local_2;
  bool local_1;
  
  local_2 = in_DIL & 1;
  if (local_2 == 0) {
    local_1 = false;
  }
  else {
    uVar1 = std::__cxx11::string::c_str();
    printf("Satisfying highsPause(\"%s\")\n",uVar1);
    printf("Enter any value to continue:");
    fflush(_stdout);
    pcVar2 = fgets(local_78,100,_stdin);
    if (pcVar2 != (char *)0x0) {
      printf("You entered: \"%s\"\n",local_78);
      fflush(_stdout);
    }
    local_1 = (bool)(local_2 & 1);
  }
  return local_1;
}

Assistant:

bool highsPause(const bool pause_condition, const std::string message) {
  if (!pause_condition) return pause_condition;
  printf("Satisfying highsPause(\"%s\")\n", message.c_str());
  char str[100];
  printf("Enter any value to continue:");
  fflush(stdout);
  if (fgets(str, 100, stdin) != nullptr) {
    printf("You entered: \"%s\"\n", str);
    fflush(stdout);
  }
  return pause_condition;
}